

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
absl::lts_20240722::container_internal::
btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
::erase(btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
        *this,iterator iter)

{
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
  *pbVar1;
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
  *src_node;
  int iVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  field_type fVar6;
  allocator_type *paVar7;
  size_type sVar8;
  iterator iVar9;
  iterator iter_00;
  field_type num_to_transfer;
  field_type transfer_from;
  iterator internal_iter;
  bool internal_delete;
  btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
  *this_local;
  iterator iter_local;
  iterator res;
  
  iter_local.node_._0_4_ = iter.position_;
  this_local = (btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                *)iter.node_;
  paVar7 = mutable_allocator(this);
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
  ::value_destroy((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                   *)iter.node_,(field_type)iter.position_,paVar7);
  btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
  ::update_generation((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                       *)&this_local);
  bVar3 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
          ::is_internal((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                         *)this_local);
  iVar2 = (int)iter_local.node_;
  pbVar1 = this_local;
  if (bVar3) {
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
    ::operator--((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                  *)&this_local);
    bVar4 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
            ::is_leaf((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                       *)this_local);
    src_node = this_local;
    if (!bVar4) {
      __assert_fail("iter.node_->is_leaf()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x98c,
                    "iterator absl::container_internal::btree<absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>>::erase(iterator) [Params = absl::container_internal::set_params<const google::protobuf::FieldDescriptor *, google::protobuf::compiler::java::(anonymous namespace)::FieldDescriptorCompare, std::allocator<const google::protobuf::FieldDescriptor *>, 256, false>]"
                   );
    }
    sVar8 = (size_type)(int)iter_local.node_;
    paVar7 = mutable_allocator(this);
    btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
    ::transfer((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                *)pbVar1,(long)iVar2,sVar8,
               (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                *)src_node,paVar7);
  }
  else {
    bVar5 = (char)(int)iter_local.node_ + 1;
    fVar6 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
            ::finish((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                      *)this_local);
    pbVar1 = this_local;
    sVar8 = (size_type)(int)iter_local.node_;
    paVar7 = mutable_allocator(this);
    btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
    ::transfer_n((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                  *)pbVar1,(ulong)(byte)(fVar6 - bVar5),sVar8,(ulong)bVar5,
                 (btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                  *)pbVar1,paVar7);
  }
  pbVar1 = this_local;
  fVar6 = btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
          ::finish((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                    *)this_local);
  btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
  ::set_finish((btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>
                *)pbVar1,fVar6 + 0xff);
  this->size_ = this->size_ - 1;
  iter_00.position_ = (int)iter_local.node_;
  iter_00.node_ =
       (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
        *)this_local;
  iter_00._12_4_ = 0;
  iVar9 = rebalance_after_delete(this,iter_00);
  iter_local._8_8_ = iVar9.node_;
  if (bVar3) {
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
    ::operator++((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>,_256,_false>_>,_const_google::protobuf::FieldDescriptor_*const_&,_const_google::protobuf::FieldDescriptor_*const_*>
                  *)&iter_local.position_);
  }
  iVar9.node_ = (btree_node<absl::lts_20240722::container_internal::map_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::compiler::CommandLineInterface::GeneratorInfo>_>,_256,_false>_>
                 *)iter_local._8_8_;
  iVar9._12_4_ = 0;
  return iVar9;
}

Assistant:

auto btree<P>::erase(iterator iter) -> iterator {
  iter.node_->value_destroy(static_cast<field_type>(iter.position_),
                            mutable_allocator());
  iter.update_generation();

  const bool internal_delete = iter.node_->is_internal();
  if (internal_delete) {
    // Deletion of a value on an internal node. First, transfer the largest
    // value from our left child here, then erase/rebalance from that position.
    // We can get to the largest value from our left child by decrementing iter.
    iterator internal_iter(iter);
    --iter;
    assert(iter.node_->is_leaf());
    internal_iter.node_->transfer(
        static_cast<size_type>(internal_iter.position_),
        static_cast<size_type>(iter.position_), iter.node_,
        mutable_allocator());
  } else {
    // Shift values after erased position in leaf. In the internal case, we
    // don't need to do this because the leaf position is the end of the node.
    const field_type transfer_from =
        static_cast<field_type>(iter.position_ + 1);
    const field_type num_to_transfer = iter.node_->finish() - transfer_from;
    iter.node_->transfer_n(num_to_transfer,
                           static_cast<size_type>(iter.position_),
                           transfer_from, iter.node_, mutable_allocator());
  }
  // Update node finish and container size.
  iter.node_->set_finish(iter.node_->finish() - 1);
  --size_;

  // We want to return the next value after the one we just erased. If we
  // erased from an internal node (internal_delete == true), then the next
  // value is ++(++iter). If we erased from a leaf node (internal_delete ==
  // false) then the next value is ++iter. Note that ++iter may point to an
  // internal node and the value in the internal node may move to a leaf node
  // (iter.node_) when rebalancing is performed at the leaf level.

  iterator res = rebalance_after_delete(iter);

  // If we erased from an internal node, advance the iterator.
  if (internal_delete) {
    ++res;
  }
  return res;
}